

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

Frame * __thiscall mkvparser::Block::GetFrame(Block *this,int idx)

{
  Frame *pFVar1;
  
  if (idx < 0) {
    __assert_fail("idx >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1f7f,"const Block::Frame &mkvparser::Block::GetFrame(int) const");
  }
  if (this->m_frame_count <= idx) {
    __assert_fail("idx < m_frame_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1f80,"const Block::Frame &mkvparser::Block::GetFrame(int) const");
  }
  if (this->m_frames[(uint)idx].pos < 1) {
    __assert_fail("f.pos > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1f83,"const Block::Frame &mkvparser::Block::GetFrame(int) const");
  }
  pFVar1 = this->m_frames + (uint)idx;
  if (0 < pFVar1->len) {
    return pFVar1;
  }
  __assert_fail("f.len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1f84,"const Block::Frame &mkvparser::Block::GetFrame(int) const");
}

Assistant:

const Block::Frame& Block::GetFrame(int idx) const {
  assert(idx >= 0);
  assert(idx < m_frame_count);

  const Frame& f = m_frames[idx];
  assert(f.pos > 0);
  assert(f.len > 0);

  return f;
}